

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

void dict_free(dict_t *d)

{
  dictword_t *pdVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (d != (dict_t *)0x0) {
    if (0 < d->n_word) {
      lVar4 = 8;
      lVar5 = 0;
      do {
        pdVar1 = d->word;
        pvVar2 = *(void **)((long)pdVar1 + lVar4 + -8);
        if (pvVar2 != (void *)0x0) {
          ckd_free(pvVar2);
        }
        pvVar2 = *(void **)((long)&pdVar1->word + lVar4);
        if (pvVar2 != (void *)0x0) {
          ckd_free(pvVar2);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 < d->n_word);
    }
    if (d->word != (dictword_t *)0x0) {
      ckd_free(d->word);
    }
    iVar3 = d->n_ciphone;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        if (d->ciphone_str[lVar4] != (char *)0x0) {
          ckd_free(d->ciphone_str[lVar4]);
          iVar3 = d->n_ciphone;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    if (d->ciphone_str != (char **)0x0) {
      ckd_free(d->ciphone_str);
    }
    if (d->pht != (hash_table_t *)0x0) {
      hash_table_free(d->pht);
    }
    if (d->ht != (hash_table_t *)0x0) {
      hash_table_free(d->ht);
    }
    ckd_free(d);
    return;
  }
  return;
}

Assistant:

void
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d) {                    /* Clean up the dictionary stuff */
        /* First Step, free all memory allocated for each word */
        for (i = 0; i < d->n_word; i++) {
            word = (dictword_t *) & (d->word[i]);
            if (word->word)
                ckd_free((void *) word->word);
            if (word->ciphone)
                ckd_free((void *) word->ciphone);
        }

        if (d->word)
            ckd_free((void *) d->word);
        for (i = 0; i < d->n_ciphone; i++) {
            if (d->ciphone_str[i])
                ckd_free((void *) d->ciphone_str[i]);
        }
        if (d->ciphone_str)
            ckd_free((void *) d->ciphone_str);
        if (d->pht)
            hash_table_free(d->pht);
        if (d->ht)
            hash_table_free(d->ht);
        ckd_free((void *) d);
    }
}